

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

int mbedtls_mpi_core_random
              (mbedtls_mpi_uint *X,mbedtls_mpi_uint min,mbedtls_mpi_uint *N,size_t limbs,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t sVar2;
  ulong n_bytes_00;
  mbedtls_ct_condition_t mVar3;
  mbedtls_ct_condition_t y;
  mbedtls_ct_uint_t mVar4;
  int local_60;
  int count;
  int ret;
  size_t n_bytes;
  size_t n_bits;
  mbedtls_ct_condition_t lt_upper;
  mbedtls_ct_condition_t ge_lower;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t limbs_local;
  mbedtls_mpi_uint *N_local;
  mbedtls_mpi_uint min_local;
  mbedtls_mpi_uint *X_local;
  
  mbedtls_ct_compiler_opaque(0xffffffffffffffff);
  mbedtls_ct_compiler_opaque(0);
  sVar2 = mbedtls_mpi_core_bitlen(N,limbs);
  n_bytes_00 = sVar2 + 7 >> 3;
  local_60 = 0xfa;
  if (4 < n_bytes_00) {
    local_60 = 0x1e;
  }
  while( true ) {
    iVar1 = mbedtls_mpi_core_fill_random(X,limbs,n_bytes_00,f_rng,p_rng);
    if (iVar1 != 0) {
      return iVar1;
    }
    mbedtls_mpi_core_shift_r(X,limbs,n_bytes_00 * 8 - sVar2);
    local_60 = local_60 + -1;
    if (local_60 == 0) break;
    mVar3 = mbedtls_mpi_core_uint_le_mpi(min,X,limbs);
    y = mbedtls_mpi_core_lt_ct(X,N,limbs);
    mVar3 = mbedtls_ct_bool_and(mVar3,y);
    mVar4 = mbedtls_ct_compiler_opaque(0);
    if (mVar3 != mVar4) {
      return 0;
    }
  }
  return -0xe;
}

Assistant:

int mbedtls_mpi_core_random(mbedtls_mpi_uint *X,
                            mbedtls_mpi_uint min,
                            const mbedtls_mpi_uint *N,
                            size_t limbs,
                            int (*f_rng)(void *, unsigned char *, size_t),
                            void *p_rng)
{
    mbedtls_ct_condition_t ge_lower = MBEDTLS_CT_TRUE, lt_upper = MBEDTLS_CT_FALSE;
    size_t n_bits = mbedtls_mpi_core_bitlen(N, limbs);
    size_t n_bytes = (n_bits + 7) / 8;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /*
     * When min == 0, each try has at worst a probability 1/2 of failing
     * (the msb has a probability 1/2 of being 0, and then the result will
     * be < N), so after 30 tries failure probability is a most 2**(-30).
     *
     * When N is just below a power of 2, as is the case when generating
     * a random scalar on most elliptic curves, 1 try is enough with
     * overwhelming probability. When N is just above a power of 2,
     * as when generating a random scalar on secp224k1, each try has
     * a probability of failing that is almost 1/2.
     *
     * The probabilities are almost the same if min is nonzero but negligible
     * compared to N. This is always the case when N is crypto-sized, but
     * it's convenient to support small N for testing purposes. When N
     * is small, use a higher repeat count, otherwise the probability of
     * failure is macroscopic.
     */
    int count = (n_bytes > 4 ? 30 : 250);

    /*
     * Match the procedure given in RFC 6979 §3.3 (deterministic ECDSA)
     * when f_rng is a suitably parametrized instance of HMAC_DRBG:
     * - use the same byte ordering;
     * - keep the leftmost n_bits bits of the generated octet string;
     * - try until result is in the desired range.
     * This also avoids any bias, which is especially important for ECDSA.
     */
    do {
        MBEDTLS_MPI_CHK(mbedtls_mpi_core_fill_random(X, limbs,
                                                     n_bytes,
                                                     f_rng, p_rng));
        mbedtls_mpi_core_shift_r(X, limbs, 8 * n_bytes - n_bits);

        if (--count == 0) {
            ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            goto cleanup;
        }

        ge_lower = mbedtls_mpi_core_uint_le_mpi(min, X, limbs);
        lt_upper = mbedtls_mpi_core_lt_ct(X, N, limbs);
    } while (mbedtls_ct_bool_and(ge_lower, lt_upper) == MBEDTLS_CT_FALSE);

cleanup:
    return ret;
}